

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_WSwan_Reg(VGMPlayer *this)

{
  CHIP_DEVICE *pCVar1;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  pCVar1 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        (UINT8)((int)(this->_fileData[(ulong)this->_filePos + 1] & 0x80) >> 7));
  if ((pCVar1 != (CHIP_DEVICE *)0x0) && (pCVar1->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    (*pCVar1->write8)((pCVar1->base).defInf.dataPtr,
                      (this->_fileData[(ulong)this->_filePos + 1] & 0x7f) + 0x80,
                      this->_fileData[(ulong)this->_filePos + 2]);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_WSwan_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	cDev->write8(cDev->base.defInf.dataPtr, 0x80 + (fData[0x01] & 0x7F), fData[0x02]);
	return;
}